

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Vec_Ptr_t *
Abc_GiaDeriveSops(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,Vec_Wec_t *vSupps,int nCubeLim,int nBTLimit,
                 int nCostMax,int fCanon,int fReverse,int fCnfShared,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Wec_t *p_00;
  abctime aVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *__ptr;
  Vec_Ptr_t *p_02;
  ProgressBar *p_03;
  Vec_Str_t *p_04;
  char *Entry;
  Vec_Ptr_t *p_05;
  void *Entry_00;
  ulong uVar7;
  abctime time;
  char *pString;
  char *pString_00;
  int iVar8;
  uint i;
  ulong uVar9;
  uint nCap;
  uint uVar10;
  Cnf_Dat_t *local_80;
  Vec_Int_t *local_78;
  
  aVar3 = Abc_Clock();
  iVar8 = 0;
  p_00 = Gia_ManIsoStrashReduceInt(p,vSupps,0);
  if (fVerbose != 0) {
    printf("Considering %d (out of %d) outputs. ",(ulong)(uint)p_00->nSize,
           (ulong)(uint)p->vCos->nSize);
    aVar4 = Abc_Clock();
    Abc_PrintTime(0x6a713f,(char *)(aVar4 - aVar3),time);
  }
  p_01 = Vec_IntAlloc(p_00->nSize);
  for (; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
    pVVar5 = Vec_WecEntry(p_00,iVar8);
    if (0 < pVVar5->nSize) {
      iVar1 = Vec_IntEntry(pVVar5,0);
      Vec_IntPush(p_01,iVar1);
    }
  }
  nCap = p_01->nSize;
  pVVar5 = Vec_IntAlloc(nCap);
  uVar10 = 0;
  i = 0;
  if (0 < (int)nCap) {
    uVar10 = nCap;
    i = 0;
  }
  for (; uVar10 != i; i = i + 1) {
    iVar8 = Vec_IntEntry(p_01,i);
    pVVar6 = Vec_WecEntry(vSupps,iVar8);
    Vec_IntPush(pVVar5,pVVar6->nSize);
  }
  __ptr = Abc_MergeSortCost(pVVar5->pArray,pVVar5->nSize);
  Vec_IntFree(pVVar5);
  p_05 = (Vec_Ptr_t *)0x0;
  if (fCnfShared == 0) {
    local_80 = (Cnf_Dat_t *)0x0;
    local_78 = (Vec_Int_t *)0x0;
  }
  else {
    iVar8 = p->nObjs;
    local_78 = Vec_IntAlloc(iVar8);
    local_78->nSize = iVar8;
    memset(local_78->pArray,0xff,(long)iVar8 << 2);
    local_80 = Mf_ManGenerateCnf(p,8,1,0,0);
  }
  p_02 = Vec_PtrStart(nCap);
  p_03 = Extra_ProgressBarStart(_stdout,nCap);
  Extra_ProgressBarUpdate(p_03,0,pString);
  for (uVar9 = 0; nCap = nCap - 1, uVar10 != uVar9; uVar9 = uVar9 + 1) {
    iVar8 = __ptr[(int)nCap];
    iVar1 = Vec_IntEntry(p_01,iVar8);
    pVVar5 = Vec_WecEntry(vSupps,iVar1);
    if (pVVar5->nSize < 2) {
      Vec_PtrWriteEntry(p_02,iVar8,(void *)0x1);
    }
    else {
      iVar2 = 0;
      if (uVar9 == 0) {
        iVar2 = fVerbose;
      }
      pVVar6 = Vec_WecEntry(p_00,iVar8);
      if (fCanon == 0 && fCnfShared != 0) {
        p_04 = Abc_NtkClpGiaOne2(local_80,p,iVar1,nCubeLim,nBTLimit,0,fReverse,pVVar5,local_78,iVar2
                                 ,pVVar6,vSupps);
      }
      else {
        p_04 = Abc_NtkClpGiaOne(p,iVar1,nCubeLim,nBTLimit,fCanon,fReverse,pVVar5,iVar2,pVVar6,vSupps
                               );
      }
      if (p_04 == (Vec_Str_t *)0x0) goto LAB_0022a1dd;
      pVVar5 = Vec_WecEntry(vSupps,iVar1);
      iVar1 = pVVar5->nSize;
      iVar2 = Abc_SopGetVarNum(p_04->pArray);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                      ,0x33b,
                      "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                     );
      }
      Extra_ProgressBarUpdate(p_03,(int)uVar9,pString_00);
      Entry = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,p_04->pArray);
      Vec_PtrWriteEntry(p_02,iVar8,Entry);
      Vec_StrFree(p_04);
    }
  }
  Extra_ProgressBarStop(p_03);
  if (fCnfShared != 0) {
    Cnf_DataFree(local_80);
    Vec_IntFree(local_78);
  }
  p_05 = Vec_PtrStart(p->vCos->nSize);
  for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
    pVVar5 = Vec_WecEntry(p_00,iVar8);
    for (iVar1 = 0; iVar1 < pVVar5->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iVar1);
      Entry_00 = Vec_PtrEntry(p_02,iVar8);
      Vec_PtrWriteEntry(p_05,iVar2,Entry_00);
    }
  }
  uVar7 = 0;
  uVar9 = (ulong)(uint)p_05->nSize;
  if (p_05->nSize < 1) {
    uVar9 = uVar7;
  }
  iVar8 = 0;
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    iVar8 = iVar8 + (uint)(p_05->pArray[uVar7] == (void *)0x0);
  }
  if (iVar8 != 0) {
    __assert_fail("Vec_PtrCountZero(vSops) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                  ,0x34b,
                  "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                 );
  }
LAB_0022a1dd:
  free(__ptr);
  Vec_IntFree(p_01);
  Vec_WecFree(p_00);
  Vec_PtrFree(p_02);
  return p_05;
}

Assistant:

Vec_Ptr_t * Abc_GiaDeriveSops( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, Vec_Wec_t * vSupps, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    ProgressBar * pProgress;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vSops = NULL, * vSopsRepr;
    Vec_Int_t * vReprs, * vClass, * vReprSuppSizes;
    int i, k, Entry, iCo, * pOrder;
    Vec_Wec_t * vClasses;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vMap = NULL;
    // derive classes of outputs
    vClasses = Gia_ManIsoStrashReduceInt( p, vSupps, 0 );
    if ( fVerbose )
    {
        printf( "Considering %d (out of %d) outputs. ", Vec_WecSize(vClasses), Gia_ManCoNum(p) );
        Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    }
    // derive representatives
    vReprs = Vec_WecCollectFirsts( vClasses );
    vReprSuppSizes = Vec_IntAlloc( Vec_IntSize(vReprs) );
    Vec_IntForEachEntry( vReprs, Entry, i )
        Vec_IntPush( vReprSuppSizes, Vec_IntSize(Vec_WecEntry(vSupps, Entry)) );
    pOrder = Abc_MergeSortCost( Vec_IntArray(vReprSuppSizes), Vec_IntSize(vReprSuppSizes) );
    Vec_IntFree( vReprSuppSizes );
    // consider SOPs for representatives
    if ( fCnfShared )
    {
        vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
        pCnf = Mf_ManGenerateCnf( p, 8, 1, 0, 0 );
    }
    vSopsRepr = Vec_PtrStart( Vec_IntSize(vReprs) );
    pProgress = Extra_ProgressBarStart( stdout, Vec_IntSize(vReprs) );
    Extra_ProgressBarUpdate( pProgress, 0, NULL );
    for ( i = 0; i < Vec_IntSize(vReprs); i++ )
    {
        int iEntry        = pOrder[Vec_IntSize(vReprs) - 1 - i];
        int iCoThis       = Vec_IntEntry( vReprs, iEntry );
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, iCoThis );
        Vec_Str_t * vSop;
        if ( Vec_IntSize(vSupp) < 2 )
        {
            Vec_PtrWriteEntry( vSopsRepr, iEntry, (void *)(ABC_PTRINT_T)1 );
            continue;
        }
        if ( fCnfShared && !fCanon )
            vSop = Abc_NtkClpGiaOne2( pCnf, p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, vMap, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        else
            vSop = Abc_NtkClpGiaOne( p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        if ( vSop == NULL )
            goto finish;
        assert( Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop)) );
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Vec_PtrWriteEntry( vSopsRepr, iEntry, Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vSop) ) );
        Vec_StrFree( vSop );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fCnfShared )
    {
        Cnf_DataFree( pCnf );
        Vec_IntFree( vMap );
    }
    // derive SOPs for each output
    vSops = Vec_PtrStart( Gia_ManCoNum(p) );
    Vec_WecForEachLevel ( vClasses, vClass, i )
        Vec_IntForEachEntry( vClass, iCo, k )
            Vec_PtrWriteEntry( vSops, iCo, Vec_PtrEntry(vSopsRepr, i) );
    assert( Vec_PtrCountZero(vSops) == 0 );
/*
    // verify
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, i );
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        assert( Vec_IntSize(vSupp) == Abc_SopGetVarNum(pSop) );
    }
*/
    // cleanup
finish:
    ABC_FREE( pOrder );
    Vec_IntFree( vReprs );
    Vec_WecFree( vClasses );
    Vec_PtrFree( vSopsRepr );
    return vSops;
}